

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8_t *target)

{
  int size;
  uint8_t *puVar1;
  uint8_t *target_local;
  MessageLite *this_local;
  
  size = GetCachedSize(this);
  puVar1 = SerializeToArrayImpl(this,target,size);
  return puVar1;
}

Assistant:

uint8_t* MessageLite::SerializeWithCachedSizesToArray(uint8_t* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}